

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

void t_outline(out_stream_info *stream,int nl,char *txt,int *attr)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  char buf [2048];
  char local_828 [2048];
  
  pcVar1 = local_828;
  if ((stream != &G_std_disp) || (scrquiet == 0)) {
    if ((nl != 0) &&
       (((stream->use_more_mode != 0 && (scrfp == (FILE *)0x0)) && (G_os_moremode != 0)))) {
      iVar3 = stream->linecnt;
      stream->linecnt = iVar3 + 1;
      if (G_os_pagelength <= iVar3) {
        out_more_prompt();
      }
    }
    for (lVar4 = 0; cVar2 = txt[lVar4], cVar2 != '\0'; lVar4 = lVar4 + 1) {
      if ((attr != (int *)0x0) && (iVar3 = attr[lVar4], iVar3 != stream->os_attr)) {
        if (pcVar1 != local_828) {
          *pcVar1 = '\0';
          (*stream->do_print)(stream,local_828);
          iVar3 = attr[lVar4];
        }
        os_set_text_attr(iVar3);
        stream->os_attr = attr[lVar4];
        cVar2 = txt[lVar4];
        pcVar1 = local_828;
      }
      *pcVar1 = cVar2;
      pcVar1 = pcVar1 + 1;
    }
    if (pcVar1 != local_828) {
      *pcVar1 = '\0';
      (*stream->do_print)(stream,local_828);
    }
  }
  return;
}

Assistant:

static void t_outline(out_stream_info *stream, int nl,
                      const char *txt, const int *attr)
{
    extern int scrquiet;

    /* 
     *   Check the "script quiet" mode - this indicates that we're reading
     *   a script and not echoing output to the display.  If this mode is
     *   on, and we're writing to the display, suppress this write.  If
     *   the mode is off, or we're writing to another stream (such as the
     *   log file), show the output as normal.  
     */
    if (!scrquiet || stream != &G_std_disp)
    {
        size_t i;
        char buf[MAXWIDTH];
        char *dst;
        
        /*
         *   Check to see if we've reached the end of the screen, and if
         *   so run the MORE prompt.  Note that we don't make this check
         *   at all if USE_MORE is undefined, since this means that the OS
         *   layer code is taking responsibility for pagination issues.
         *   We also don't display a MORE prompt when reading from a
         *   script file.
         *   
         *   Note that we suppress the MORE prompt if nl == 0, since this
         *   is used to flush a partial line of text without starting a
         *   new line (for example, when displaying a prompt where the
         *   input will appear on the same line following the prompt).
         *   
         *   Skip the MORE prompt if this stream doesn't use it.  
         */
        if (stream->use_more_mode
            && scrfp == 0
            && G_os_moremode
            && nl != 0 && nl != 4
            && stream->linecnt++ >= G_os_pagelength)
        {
            /* display the MORE prompt */
            out_more_prompt();
        }

        /*
         *   Display the text.  Run through the text in pieces; each time the
         *   attributes change, set attributes at the osifc level. 
         */
        for (i = 0, dst = buf ; txt[i] != '\0' ; ++i)
        {
            /* if the attribute is changing, notify osifc */
            if (attr != 0 && attr[i] != stream->os_attr)
            {
                /* flush the preceding text */
                if (dst != buf)
                {
                    *dst = '\0';
                    stream_print(stream, buf);
                }

                /* set the new attribute */
                os_set_text_attr(attr[i]);

                /* remember this as the last OS attribute */
                stream->os_attr = attr[i];

                /* start with a fresh buffer */
                dst = buf;
            }

            /* buffer this character */
            *dst++ = txt[i];
        }

        /* flush the last chunk of text */
        if (dst != buf)
        {
            *dst = '\0';
            stream_print(stream, buf);
        }
    }
}